

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getPageMMap(Pager *pPager,Pgno pgno,DbPage **ppPage,int flags)

{
  bool local_4a;
  bool local_49;
  void *local_48;
  void *pData;
  int bMmapOk;
  u32 iFrame;
  PgHdr *pPg;
  int rc;
  int flags_local;
  DbPage **ppPage_local;
  Pager *pPStack_18;
  Pgno pgno_local;
  Pager *pPager_local;
  
  pPg._0_4_ = 0;
  _bMmapOk = (DbPage *)0x0;
  pData._4_4_ = 0;
  local_49 = false;
  if (1 < pgno) {
    local_4a = pPager->eState == '\x01' || (flags & 2U) != 0;
    local_49 = local_4a;
  }
  pData._0_4_ = (uint)local_49;
  pPg._4_4_ = flags;
  _rc = ppPage;
  ppPage_local._4_4_ = pgno;
  pPStack_18 = pPager;
  if ((pgno < 2) && (pgno == 0)) {
    pPager_local._4_4_ = sqlite3CorruptError(0xcef1);
  }
  else if (((uint)pData == 0) ||
          ((pPager->pWal == (Wal *)0x0 ||
           (pPager_local._4_4_ = sqlite3WalFindFrame(pPager->pWal,pgno,(u32 *)((long)&pData + 4)),
           pPager_local._4_4_ == 0)))) {
    pPg._0_4_ = 0;
    if (((uint)pData != 0) && (pData._4_4_ == 0)) {
      local_48 = (void *)0x0;
      pPg._0_4_ = sqlite3OsFetch(pPStack_18->fd,
                                 (ulong)(ppPage_local._4_4_ - 1) * (long)pPStack_18->pageSize,
                                 pPStack_18->pageSize,&local_48);
      if (((int)pPg == 0) && (local_48 != (void *)0x0)) {
        if ((1 < pPStack_18->eState) || (pPStack_18->tempFile != '\0')) {
          _bMmapOk = sqlite3PagerLookup(pPStack_18,ppPage_local._4_4_);
        }
        if (_bMmapOk == (DbPage *)0x0) {
          pPg._0_4_ = pagerAcquireMapPage(pPStack_18,ppPage_local._4_4_,local_48,(PgHdr **)&bMmapOk)
          ;
        }
        else {
          sqlite3OsUnfetch(pPStack_18->fd,
                           (ulong)(ppPage_local._4_4_ - 1) * (long)pPStack_18->pageSize,local_48);
        }
        if (_bMmapOk != (DbPage *)0x0) {
          *_rc = _bMmapOk;
          return 0;
        }
      }
      if ((int)pPg != 0) {
        *_rc = (DbPage *)0x0;
        return (int)pPg;
      }
    }
    pPager_local._4_4_ = getPageNormal(pPStack_18,ppPage_local._4_4_,_rc,pPg._4_4_);
  }
  else {
    *_rc = (DbPage *)0x0;
  }
  return pPager_local._4_4_;
}

Assistant:

static int getPageMMap(
  Pager *pPager,      /* The pager open on the database file */
  Pgno pgno,          /* Page number to fetch */
  DbPage **ppPage,    /* Write a pointer to the page here */
  int flags           /* PAGER_GET_XXX flags */
){
  int rc = SQLITE_OK;
  PgHdr *pPg = 0;
  u32 iFrame = 0;                 /* Frame to read from WAL file */

  /* It is acceptable to use a read-only (mmap) page for any page except
  ** page 1 if there is no write-transaction open or the ACQUIRE_READONLY
  ** flag was specified by the caller. And so long as the db is not a 
  ** temporary or in-memory database.  */
  const int bMmapOk = (pgno>1
   && (pPager->eState==PAGER_READER || (flags & PAGER_GET_READONLY))
  );

  assert( USEFETCH(pPager) );
#ifdef SQLITE_HAS_CODEC
  assert( pPager->xCodec==0 );
#endif

  /* Optimization note:  Adding the "pgno<=1" term before "pgno==0" here
  ** allows the compiler optimizer to reuse the results of the "pgno>1"
  ** test in the previous statement, and avoid testing pgno==0 in the
  ** common case where pgno is large. */
  if( pgno<=1 && pgno==0 ){
    return SQLITE_CORRUPT_BKPT;
  }
  assert( pPager->eState>=PAGER_READER );
  assert( assert_pager_state(pPager) );
  assert( pPager->hasHeldSharedLock==1 );
  assert( pPager->errCode==SQLITE_OK );

  if( bMmapOk && pagerUseWal(pPager) ){
    rc = sqlite3WalFindFrame(pPager->pWal, pgno, &iFrame);
    if( rc!=SQLITE_OK ){
      *ppPage = 0;
      return rc;
    }
  }
  if( bMmapOk && iFrame==0 ){
    void *pData = 0;
    rc = sqlite3OsFetch(pPager->fd, 
        (i64)(pgno-1) * pPager->pageSize, pPager->pageSize, &pData
    );
    if( rc==SQLITE_OK && pData ){
      if( pPager->eState>PAGER_READER || pPager->tempFile ){
        pPg = sqlite3PagerLookup(pPager, pgno);
      }
      if( pPg==0 ){
        rc = pagerAcquireMapPage(pPager, pgno, pData, &pPg);
     }else{
        sqlite3OsUnfetch(pPager->fd, (i64)(pgno-1)*pPager->pageSize, pData);
      }
      if( pPg ){
        assert( rc==SQLITE_OK );
        *ppPage = pPg;
        return SQLITE_OK;
      }
    }
    if( rc!=SQLITE_OK ){
      *ppPage = 0;
      return rc;
    }
  }
  return getPageNormal(pPager, pgno, ppPage, flags);
}